

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_helpers.hpp
# Opt level: O2

void ear::
     mask_write<Eigen::Matrix<double,3,1,0,3,1>&,std::vector<bool,std::allocator<bool>>,Eigen::Matrix<double,2,1,0,2,1>>
               (Matrix<double,_3,_1,_0,_3,_1> *out,vector<bool,_std::allocator<bool>_> *mask,
               Matrix<double,_2,_1,_0,_2,_1> *values)

{
  double dVar1;
  const_reference cVar2;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  size_type index;
  size_type sVar5;
  size_type sVar6;
  size_type __n;
  
  sVar6 = (ulong)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_offset +
          ((long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
          (long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8;
  _assert_impl(sVar6 == 3,"in mask_write: out_size and mask_write must be the same length");
  if ((long)sVar6 < 1) {
    sVar6 = 0;
  }
  index = 0;
  for (__n = 0; sVar6 != __n; __n = __n + 1) {
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,__n);
    sVar5 = index;
    if (cVar2) {
      sVar5 = index + 1;
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)values,index);
      dVar1 = *pdVar3;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)out,__n);
      *pSVar4 = dVar1;
    }
    index = sVar5;
  }
  _assert_impl(index == 2,"in mask_size: length of values must equal the number of entries in mask")
  ;
  return;
}

Assistant:

void mask_write(OutT &&out, const MaskT &mask, const ValuesT &values) {
    Eigen::Index out_size = out.size();
    Eigen::Index mask_size = mask.size();
    Eigen::Index values_size = values.size();

    ear_assert(
        out_size == mask_size,
        "in mask_write: out_size and mask_write must be the same length");

    Eigen::Index j = 0;
    for (Eigen::Index i = 0; i < mask_size; i++)
      if (mask[i]) vec_write(out, i, values[j++]);

    ear_assert(j == values_size,
               "in mask_size: length of values must equal the number of "
               "entries in mask");
  }